

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSRGBDecodeTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::anon_unknown_0::SRGBTestCase::toggleDecode
          (SRGBTestCase *this,
          vector<deqp::gles31::Functional::(anonymous_namespace)::UniformData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformData>_>
          *uniformDataList)

{
  SRGBDecode SVar1;
  SRGBTestTexture *this_00;
  pointer pUVar2;
  pointer pUVar3;
  long lVar4;
  long lVar5;
  
  pUVar2 = (uniformDataList->
           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformData>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pUVar3 = (uniformDataList->
           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformData>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (0 < (int)((ulong)((long)pUVar3 - (long)pUVar2) >> 4) * -0x55555555) {
    lVar5 = 5;
    lVar4 = 0;
    do {
      if ((char)(&pUVar2->location)[lVar5 * 2] == '\x01') {
        this_00 = (this->m_textureSourceList).
                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar4];
        SVar1 = this_00->m_decoding;
        if (SVar1 != SRGBDECODE_DECODE_DEFAULT) {
          SRGBTestTexture::setDecode
                    (this_00,(SVar1 + SRGBDECODE_DECODE) -
                             ((SVar1 - ((int)(SVar1 + SRGBDECODE_DECODE) >> 0x1f)) + 1 & 0xfffffffe)
                    );
          pUVar2 = (uniformDataList->
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformData>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          pUVar3 = (uniformDataList->
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformData>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        }
      }
      lVar4 = lVar4 + 1;
      lVar5 = lVar5 + 6;
    } while (lVar4 < (int)((ulong)((long)pUVar3 - (long)pUVar2) >> 4) * -0x55555555);
  }
  return;
}

Assistant:

void SRGBTestCase::toggleDecode (const std::vector<UniformData>& uniformDataList)
{
	DE_ASSERT( uniformDataList.size() <= m_textureSourceList.size() );

	for (int uniformIdx = 0; uniformIdx < (int)uniformDataList.size(); uniformIdx++)
	{
		if (uniformDataList[uniformIdx].toggleDecode == true)
		{
			if (m_textureSourceList[uniformIdx]->getDecode() == SRGBDECODE_DECODE_DEFAULT)
			{
				// cannot toggle default
				continue;
			}

			// toggle sRGB decode values (ignoring value if set to default)
			m_textureSourceList[uniformIdx]->setDecode((SRGBDecode)((m_textureSourceList[uniformIdx]->getDecode() + 1) % SRGBDECODE_DECODE_DEFAULT));
		}
	}
}